

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

HighsCDouble __thiscall
HighsHessian::objectiveCDoubleValue
          (HighsHessian *this,vector<double,_std::allocator<double>_> *solution)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  int *in_RDI;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsInt iCol;
  HighsCDouble objective_function_value;
  double in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_2c;
  int local_24;
  HighsCDouble local_10;
  
  HighsCDouble::HighsCDouble(&local_10,0.0);
  for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_24);
    iVar1 = *pvVar2;
    std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)iVar1);
    std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
    HighsCDouble::operator+=
              ((HighsCDouble *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_24);
    local_2c = *pvVar2;
    while( true ) {
      local_2c = local_2c + 1;
      in_stack_ffffffffffffffb4 = local_2c;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_24 + 1));
      if (*pvVar2 <= in_stack_ffffffffffffffb4) break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
      in_stack_ffffffffffffffa8 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_2c);
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 * *pvVar3;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_2c);
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar2);
      HighsCDouble::operator+=
                ((HighsCDouble *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
  }
  return local_10;
}

Assistant:

HighsCDouble HighsHessian::objectiveCDoubleValue(
    const std::vector<double>& solution) const {
  HighsCDouble objective_function_value = HighsCDouble(0);
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    HighsInt iEl = this->start_[iCol];
    assert(this->index_[iEl] == iCol);
    objective_function_value +=
        0.5 * solution[iCol] * this->value_[iEl] * solution[iCol];
    for (HighsInt iEl = this->start_[iCol] + 1; iEl < this->start_[iCol + 1];
         iEl++)
      objective_function_value +=
          solution[iCol] * this->value_[iEl] * solution[this->index_[iEl]];
  }
  return objective_function_value;
}